

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXingQtWriter.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s;
  size_t sVar1;
  QStringView text_00;
  QString filename;
  QString text;
  QImage result;
  
  if (argc != 4) {
    text.d.d._0_4_ = 2;
    text.d.size._4_4_ = 0;
    text.d.d._4_4_ = 0;
    text.d.ptr._0_4_ = 0;
    text.d.ptr._4_4_ = 0;
    text.d.size._0_4_ = 0;
    QMessageLogger::debug();
    QDebug::operator<<((QDebug *)&filename,"usage: ZXingQtWriter <format> <text> <filename>");
    QDebug::~QDebug((QDebug *)&filename);
  }
  else {
    __s = argv[1];
    sVar1 = strlen(__s);
    ZXing::BarcodeFormatFromString(sVar1,__s);
    QString::QString(&text,argv[2]);
    QString::QString(&filename,argv[3]);
    text_00.m_data._4_4_ = text.d.size._4_4_;
    text_00.m_data._0_4_ = (undefined4)text.d.size;
    text_00.m_size = (qsizetype)&result;
    ZXingQt::WriteBarcode(text_00,(BarcodeFormat)text.d.ptr);
    QImage::save((QString *)&result,(char *)&filename,0);
    QImage::~QImage(&result);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&filename.d);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&text.d);
  }
  return (uint)(argc != 4);
}

Assistant:

int main(int argc, char* argv[])
{
	if (argc != 4) {
		qDebug() << "usage: ZXingQtWriter <format> <text> <filename>";
		return 1;
	}

	auto format = ZXing::BarcodeFormatFromString(argv[1]);
	auto text = QString(argv[2]);
	auto filename = QString(argv[3]);

	auto result = ZXingQt::WriteBarcode(text, format);

	result.save(filename);

	return 0;
}